

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint int_log(uint base,uint x)

{
  uint local_b4;
  uint next_power;
  uint power;
  uint k;
  uint powers [32];
  uint local_20;
  int local_1c;
  uint result;
  uint y;
  uint q;
  uint x_local;
  uint base_local;
  
  local_1c = 1;
  local_20 = 0;
  next_power = 0;
  if ((base == 0) || (base == 1)) {
    x_local = 0x7fffffff;
  }
  else if (base == 2) {
    x_local = uint32_log2(x);
  }
  else {
    local_b4 = base;
    if (x == 0) {
      x_local = 0x80000000;
    }
    else {
      for (; (local_b4 <= x &&
             ((&power)[next_power] = local_b4, local_b4 <= (uint)(0xffffffff / (ulong)local_b4)));
          local_b4 = local_b4 * local_b4) {
        next_power = next_power + 1;
      }
      while (next_power != 0) {
        next_power = next_power - 1;
        if (local_1c * (&power)[next_power] <= x) {
          local_1c = (&power)[next_power] * local_1c;
          local_20 = (1 << ((byte)next_power & 0x1f)) + local_20;
        }
      }
      x_local = local_20;
    }
  }
  return x_local;
}

Assistant:

unsigned int_log( unsigned base, unsigned x )
{
    unsigned q = base;
    unsigned y = 1, result = 0;
    unsigned powers[ CHAR_BIT*sizeof(unsigned) ];

    /*
     We use that we want to find a binary representation
     of the log base q of x
    
     Find n s.t. q^n = x
    
     Or when n is in base 2
    
     q^(a_0 2^0 + ... + a_m 2^m ) = x 
    
       <=>
    
     q^a_0 * (q^2)^a_1 * (q^4)^a_2 * ... * (q^(2^m))^a_m = x

     So, first find the largest k s.t. q^(2^k) < x
    */

    unsigned k = 0;
    unsigned power = 1;
    unsigned next_power = q;

    if ( q == 0 || q == 1 )
        return INT_MAX;

    if ( q == 2 )
        return int_log2( x );

    if ( x == 0 )
        return INT_MIN;

    while ( next_power <= x ) {
        power = next_power;
        powers[ k ] = power;
        if ( next_power > UINT_MAX/next_power)
            break;
        next_power = next_power * next_power;
        k += 1;
    }

    /* Now we can find the logarithm */
    while (k > 0) {
        k--;
        if (y * powers[k] <= x) {
            y *= powers[k];
            result += (1 << k);
        }
    }
        
    return result;
}